

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

ModportSymbol * __thiscall
slang::ast::InterfacePortSymbol::getModport
          (InterfacePortSymbol *this,ASTContext *context,InstanceSymbol *instance,
          DeferredSourceRange sourceRange)

{
  SourceRange sourceRange_00;
  bool bVar1;
  Symbol *pSVar2;
  Diagnostic *this_00;
  long in_RDI;
  string_view sVar3;
  Diagnostic *diag;
  Symbol *sym;
  SourceLocation noteLocation;
  ASTContext *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  SourceLocation in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  DiagCode DVar4;
  Diagnostic *this_01;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  ModportSymbol *local_8;
  
  DVar4 = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
  noteLocation = (SourceLocation)&stack0x00000008;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x48));
  if (bVar1) {
    local_8 = (ModportSymbol *)0x0;
  }
  else {
    sVar3._M_str = *(char **)(in_RDI + 0x48);
    sVar3._M_len = in_stack_ffffffffffffffc0;
    pSVar2 = Scope::find((Scope *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         sVar3);
    if ((pSVar2 == (Symbol *)0x0) || (pSVar2->kind != Modport)) {
      sVar3 = (string_view)
              slang::syntax::DeferredSourceRange::operator*((DeferredSourceRange *)0x107d203);
      sourceRange_00.startLoc._4_4_ = in_stack_ffffffffffffff84;
      sourceRange_00.startLoc._0_4_ = in_stack_ffffffffffffff80;
      sourceRange_00.endLoc = in_stack_ffffffffffffff88;
      this_00 = ASTContext::addDiag(in_stack_ffffffffffffff78,DVar4,sourceRange_00);
      this_01 = *(Diagnostic **)(in_RDI + 0x50);
      Diagnostic::operator<<(this_01,sVar3);
      DVar4 = SUB84((ulong)in_RDI >> 0x20,0);
      InstanceSymbol::getDefinition((InstanceSymbol *)0x107d26e);
      Diagnostic::operator<<(this_01,sVar3);
      Diagnostic::addNote(this_00,DVar4,noteLocation);
      local_8 = (ModportSymbol *)0x0;
    }
    else {
      local_8 = Symbol::as<slang::ast::ModportSymbol>((Symbol *)0x107d2da);
    }
  }
  return local_8;
}

Assistant:

const ModportSymbol* InterfacePortSymbol::getModport(const ASTContext& context,
                                                     const InstanceSymbol& instance,
                                                     DeferredSourceRange sourceRange) const {
    if (modport.empty())
        return nullptr;

    auto sym = instance.body.find(modport);
    if (!sym || sym->kind != SymbolKind::Modport) {
        auto& diag = context.addDiag(diag::NotAModport, *sourceRange);
        diag << modport;
        diag << instance.getDefinition().name;
        diag.addNote(diag::NoteReferencedHere, location);
        return nullptr;
    }

    return &sym->as<ModportSymbol>();
}